

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

LY_ERR eval_relative_location_path
                 (lyxp_expr *exp,uint32_t *tok_idx,ly_bool all_desc,lyxp_set *set,uint32_t options)

{
  uint32_t tok_idx_00;
  ushort uVar1;
  lyxp_set_node *plVar2;
  byte *pbVar3;
  lyxp_token *plVar4;
  ly_path_predicate *predicates;
  lyd_node *plVar5;
  LY_ERR ret__;
  int iVar6;
  uint uVar7;
  LY_ERR LVar8;
  lyxp_set *set_00;
  lysc_node *plVar9;
  lys_module *plVar10;
  lysc_node *plVar11;
  lys_module *plVar12;
  lysc_node *plVar13;
  char *pcVar14;
  uint32_t *opts;
  lyd_node *plVar15;
  lysc_when *plVar16;
  char cVar17;
  lyxp_token lVar18;
  char *pcVar19;
  undefined4 uVar20;
  undefined8 *puVar21;
  long lVar22;
  ulong name_len;
  uint32_t uVar23;
  lysc_node **pplVar24;
  char *pcVar25;
  ly_ctx *plVar26;
  undefined8 uVar27;
  lyxp_axis axis;
  uint uVar28;
  uint uVar29;
  LY_ERR LVar30;
  char *pcVar31;
  ulong uVar32;
  bool bVar33;
  lysc_node *local_170;
  uint32_t ncname_len;
  char *pred;
  lys_module *moveto_mod;
  char *ncname_dict;
  uint32_t pred_len;
  lyd_node *sub;
  lys_module *local_120;
  char *ncname;
  LY_VALUE_FORMAT local_110;
  uint local_10c;
  lyd_node *local_108;
  ly_path_predicate *local_100;
  lyxp_expr *local_f8;
  uint local_f0;
  lyxp_node_type local_ec;
  uint32_t temp_lo;
  uint32_t pred_idx;
  char *local_e0;
  ulong local_d8;
  char *local_d0;
  lyxp_set result;
  
  local_d0 = "parsed";
  if (set == (lyxp_set *)0x0) {
    local_d0 = "skipped";
  }
  uVar7 = *tok_idx;
  do {
    axis = LYXP_AXIS_ATTRIBUTE;
    pcVar31 = "skipped";
    uVar32 = (ulong)uVar7;
    lVar18 = exp->tokens[uVar32];
    if (lVar18 == LYXP_TOKEN_AT) {
      if ((options & 0x20) == 0) {
        pcVar31 = "parsed";
      }
      ly_log_dbg(2,"%-27s %s %s[%u]","eval_relative_location_path",pcVar31,"@",
                 (ulong)exp->tok_pos[uVar32]);
LAB_001a11fa:
      uVar32 = (ulong)(*tok_idx + 1);
      *tok_idx = *tok_idx + 1;
      lVar18 = exp->tokens[uVar32];
    }
    else {
      if (lVar18 == LYXP_TOKEN_AXISNAME) {
        if (exp->tok_len[uVar32] - 4 < 0xf) {
          pcVar25 = exp->expr + exp->tok_pos[uVar32];
          switch(exp->tok_len[uVar32]) {
          case 4:
            iVar6 = strncmp("self",pcVar25,4);
            lVar18 = LYXP_TOKEN_AXISNAME;
            axis = LYXP_AXIS_SELF;
            if (iVar6 != 0) {
              __assert_fail("!strncmp(\"self\", str, str_len)",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                            ,0xaf,"enum lyxp_axis str2axis(const char *, uint32_t)");
            }
            break;
          case 5:
            iVar6 = strncmp("child",pcVar25,5);
            lVar18 = LYXP_TOKEN_AXISNAME;
            axis = LYXP_AXIS_CHILD;
            if (iVar6 != 0) {
              __assert_fail("!strncmp(\"child\", str, str_len)",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                            ,0xb2,"enum lyxp_axis str2axis(const char *, uint32_t)");
            }
            break;
          case 6:
            iVar6 = strncmp("parent",pcVar25,6);
            lVar18 = LYXP_TOKEN_AXISNAME;
            axis = LYXP_AXIS_PARENT;
            if (iVar6 != 0) {
              __assert_fail("!strncmp(\"parent\", str, str_len)",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                            ,0xb5,"enum lyxp_axis str2axis(const char *, uint32_t)");
            }
            break;
          default:
            goto switchD_001a0ea1_caseD_7;
          case 8:
            iVar6 = strncmp("ancestor",pcVar25,8);
            axis = LYXP_AXIS_ANCESTOR;
            lVar18 = LYXP_TOKEN_AXISNAME;
            if (iVar6 != 0) {
              __assert_fail("!strncmp(\"ancestor\", str, str_len)",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                            ,0xb8,"enum lyxp_axis str2axis(const char *, uint32_t)");
            }
            break;
          case 9:
            if (*pcVar25 == 'f') {
              iVar6 = strncmp("following",pcVar25,9);
              lVar18 = LYXP_TOKEN_AXISNAME;
              axis = LYXP_AXIS_FOLLOWING;
              if (iVar6 != 0) {
                __assert_fail("!strncmp(\"following\", str, str_len)",
                              "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                              ,0xbf,"enum lyxp_axis str2axis(const char *, uint32_t)");
              }
            }
            else if (*pcVar25 == 'a') {
              iVar6 = strncmp("attribute",pcVar25,9);
              lVar18 = LYXP_TOKEN_AXISNAME;
              if (iVar6 != 0) {
                __assert_fail("!strncmp(\"attribute\", str, str_len)",
                              "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                              ,0xbc,"enum lyxp_axis str2axis(const char *, uint32_t)");
              }
            }
            else {
              iVar6 = strncmp("preceding",pcVar25,9);
              lVar18 = LYXP_TOKEN_AXISNAME;
              axis = LYXP_AXIS_PRECEDING;
              if (iVar6 != 0) {
                __assert_fail("!strncmp(\"preceding\", str, str_len)",
                              "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                              ,0xc2,"enum lyxp_axis str2axis(const char *, uint32_t)");
              }
            }
            break;
          case 10:
            iVar6 = strncmp("descendant",pcVar25,10);
            lVar18 = LYXP_TOKEN_AXISNAME;
            axis = LYXP_AXIS_DESCENDANT;
            if (iVar6 != 0) {
              __assert_fail("!strncmp(\"descendant\", str, str_len)",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                            ,199,"enum lyxp_axis str2axis(const char *, uint32_t)");
            }
            break;
          case 0x10:
            iVar6 = strncmp("ancestor-or-self",pcVar25,0x10);
            lVar18 = LYXP_TOKEN_AXISNAME;
            axis = LYXP_AXIS_ANCESTOR_OR_SELF;
            if (iVar6 != 0) {
              __assert_fail("!strncmp(\"ancestor-or-self\", str, str_len)",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                            ,0xca,"enum lyxp_axis str2axis(const char *, uint32_t)");
            }
            break;
          case 0x11:
            if (*pcVar25 == 'f') {
              iVar6 = strncmp("following-sibling",pcVar25,0x11);
              lVar18 = LYXP_TOKEN_AXISNAME;
              axis = LYXP_AXIS_FOLLOWING_SIBLING;
              if (iVar6 != 0) {
                __assert_fail("!strncmp(\"following-sibling\", str, str_len)",
                              "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                              ,0xce,"enum lyxp_axis str2axis(const char *, uint32_t)");
              }
            }
            else {
              iVar6 = strncmp("preceding-sibling",pcVar25,0x11);
              lVar18 = LYXP_TOKEN_AXISNAME;
              axis = LYXP_AXIS_PRECEDING_SIBLING;
              if (iVar6 != 0) {
                __assert_fail("!strncmp(\"preceding-sibling\", str, str_len)",
                              "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                              ,0xd1,"enum lyxp_axis str2axis(const char *, uint32_t)");
              }
            }
            break;
          case 0x12:
            iVar6 = strncmp("descendant-or-self",pcVar25,0x12);
            lVar18 = LYXP_TOKEN_AXISNAME;
            axis = LYXP_AXIS_DESCENDANT_OR_SELF;
            if (iVar6 != 0) {
              __assert_fail("!strncmp(\"descendant-or-self\", str, str_len)",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                            ,0xd6,"enum lyxp_axis str2axis(const char *, uint32_t)");
            }
          }
        }
        else {
switchD_001a0ea1_caseD_7:
          axis = LYXP_AXIS_ANCESTOR;
          ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",
                 0xda);
          lVar18 = exp->tokens[*tok_idx];
        }
        if ((options & 0x20) == 0) {
          pcVar31 = "parsed";
        }
        pcVar25 = lyxp_token2str(lVar18);
        ly_log_dbg(2,"%-27s %s %s[%u]","eval_relative_location_path",pcVar31,pcVar25,
                   (ulong)exp->tok_pos[*tok_idx]);
        uVar7 = *tok_idx + 1;
        *tok_idx = uVar7;
        if (exp->tokens[uVar7] != LYXP_TOKEN_DCOLON) {
          __assert_fail("exp->tokens[*tok_idx] == LYXP_TOKEN_DCOLON",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                        ,0x20d4,
                        "LY_ERR eval_relative_location_path(const struct lyxp_expr *, uint32_t *, ly_bool, struct lyxp_set *, uint32_t)"
                       );
        }
        ly_log_dbg(2,"%-27s %s %s[%u]","eval_relative_location_path",pcVar31,"::",
                   (ulong)exp->tok_pos[uVar7]);
        goto LAB_001a11fa;
      }
      axis = LYXP_AXIS_CHILD;
    }
    pcVar31 = "skipped";
    switch(lVar18) {
    case LYXP_TOKEN_DOT:
      lVar18 = LYXP_TOKEN_DOT;
      if ((options & 0x20) == 0) {
        if ((options & 0x1c) == 0) {
          bVar33 = set->type == LYXP_SET_NODE_SET;
        }
        else {
          bVar33 = set->type == LYXP_SET_SCNODE_SET;
        }
        if (!bVar33) {
LAB_001a2991:
          plVar26 = set->ctx;
          pcVar31 = print_set_type(set);
          pcVar19 = "Cannot apply XPath operation %s on %s.";
          pcVar25 = "path operator";
LAB_001a29b8:
          ly_vlog(plVar26,(char *)0x0,LYVE_XPATH,pcVar19,pcVar25,pcVar31);
          return LY_EVALID;
        }
        if ((all_desc != '\0') &&
           (LVar8 = xpath_pi_node(set,LYXP_AXIS_DESCENDANT_OR_SELF,options), LVar8 != LY_SUCCESS)) {
          return LVar8;
        }
        LVar8 = xpath_pi_node(set,LYXP_AXIS_SELF,options);
        if (LVar8 != LY_SUCCESS) {
          return LVar8;
        }
        lVar18 = exp->tokens[*tok_idx];
      }
      pcVar25 = lyxp_token2str(lVar18);
      uVar7 = exp->tok_pos[*tok_idx];
      pcVar31 = local_d0;
      goto LAB_001a1615;
    case LYXP_TOKEN_DDOT:
      lVar18 = LYXP_TOKEN_DDOT;
      if ((options & 0x20) == 0) {
        if ((options & 0x1c) == 0) {
          bVar33 = set->type == LYXP_SET_NODE_SET;
        }
        else {
          bVar33 = set->type == LYXP_SET_SCNODE_SET;
        }
        if (!bVar33) goto LAB_001a2991;
        if ((all_desc != '\0') &&
           (LVar8 = xpath_pi_node(set,LYXP_AXIS_DESCENDANT_OR_SELF,options), LVar8 != LY_SUCCESS)) {
          return LVar8;
        }
        LVar8 = xpath_pi_node(set,LYXP_AXIS_PARENT,options);
        if (LVar8 != LY_SUCCESS) {
          return LVar8;
        }
        lVar18 = exp->tokens[*tok_idx];
        pcVar31 = "parsed";
      }
      pcVar25 = lyxp_token2str(lVar18);
      uVar7 = exp->tok_pos[*tok_idx];
LAB_001a1615:
      ly_log_dbg(2,"%-27s %s %s[%u]","eval_relative_location_path",pcVar31,pcVar25,(ulong)uVar7);
      *tok_idx = *tok_idx + 1;
      break;
    default:
      plVar26 = set->ctx;
      uVar27 = 0x2126;
LAB_001a29e6:
      ly_log(plVar26,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",uVar27
            );
      return LY_EINT;
    case LYXP_TOKEN_NAMETEST:
      ncname_dict = (char *)0x0;
      moveto_mod = (lys_module *)0x0;
      local_100 = (ly_path_predicate *)0x0;
      pcVar25 = "parsed";
      if ((options & 0x20) != 0) {
        pcVar25 = pcVar31;
      }
      ly_log_dbg(2,"%-27s %s %s[%u]","eval_name_test_with_predicate",pcVar25,"NameTest");
      uVar7 = *tok_idx;
      *tok_idx = uVar7 + 1;
      if ((options & 0x20) == 0) {
        ncname = exp->expr + exp->tok_pos[uVar7];
        ncname_len = exp->tok_len[uVar7];
        if (exp->expr[exp->tok_pos[uVar7]] == '*' && ncname_len == 1) goto LAB_001a13a9;
        LVar8 = moveto_resolve_model(&ncname,&ncname_len,set,(lysc_node *)0x0,&moveto_mod);
        if (LVar8 == LY_SUCCESS) {
          if ((*ncname == '*') && (ncname_len == 1)) goto LAB_001a13a9;
          if ((all_desc != '\0') ||
             (((axis != LYXP_AXIS_CHILD ||
               (set->format != LY_VALUE_JSON && moveto_mod == (lys_module *)0x0)) ||
              (set->type != LYXP_SET_NODE_SET)))) {
LAB_001a2168:
            LVar8 = lydict_insert(set->ctx,ncname,(ulong)ncname_len,&ncname_dict);
            if (LVar8 == LY_SUCCESS) goto LAB_001a13a9;
            goto LAB_001a149f;
          }
          local_170 = (lysc_node *)0x0;
          uVar32 = 0;
          while (uVar32 < set->used) {
            plVar26 = set->ctx;
            plVar15 = (set->val).nodes[uVar32].node;
            local_e0 = ncname;
            name_len = (ulong)ncname_len;
            local_ec = set->root_type;
            local_110 = set->format;
            result._0_8_ = result._0_8_ & 0xffffffff00000000;
            local_120 = moveto_mod;
            pcVar31 = ncname;
            plVar5 = plVar15;
            local_d8 = uVar32;
            if (moveto_mod == (lys_module *)0x0 && local_110 != LY_VALUE_JSON) {
              __assert_fail("(format == LY_VALUE_JSON) || moveto_mod",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                            ,0x1f3b,
                            "LY_ERR eval_name_test_with_predicate_get_scnode(const struct ly_ctx *, const struct lyd_node *, const char *, uint32_t, const struct lys_module *, enum lyxp_node_type, LY_VALUE_FORMAT, const struct lysc_node **)"
                           );
            }
            do {
              local_108 = plVar5;
              if (plVar15 == (lyd_node *)0x0) {
                if ((local_110 == LY_VALUE_JSON) && (local_120 == (lys_module *)0x0)) {
                  do {
                    plVar10 = ly_ctx_get_module_iter(plVar26,&result.type);
                    if (plVar10 == (lys_module *)0x0) goto LAB_001a1a3b;
                  } while ((plVar10->implemented == '\0') ||
                          (plVar13 = lys_find_child((lysc_node *)0x0,plVar10,pcVar31,name_len,0,0),
                          plVar13 == (lysc_node *)0x0));
                  local_120 = (lys_module *)0x0;
                }
                else {
                  plVar13 = lys_find_child((lysc_node *)0x0,local_120,pcVar31,name_len,0,0);
                }
LAB_001a19db:
                plVar15 = local_108;
                if ((local_ec == LYXP_NODE_ROOT_CONFIG) && (plVar13 != (lysc_node *)0x0)) {
                  if ((plVar13->flags & 2) == 0) {
LAB_001a1a15:
                    bVar33 = local_170 != (lysc_node *)0x0;
                    local_170 = plVar13;
                    if (bVar33) goto LAB_001a2168;
                  }
                }
                else if (plVar13 != (lysc_node *)0x0) goto LAB_001a1a15;
              }
              else {
                plVar13 = plVar15->schema;
                if (plVar13 != (lysc_node *)0x0) {
                  if (local_170 != (lysc_node *)0x0) {
                    plVar9 = lysc_data_node(local_170->parent);
                    plVar13 = plVar15->schema;
                    if (plVar9 == plVar13) goto LAB_001a1a23;
                  }
                  pcVar31 = local_e0;
                  plVar10 = local_120;
                  if ((local_110 == LY_VALUE_JSON) && (local_120 == (lys_module *)0x0)) {
                    plVar10 = plVar13->module;
                  }
                  local_f0 = (uint)plVar13->nodetype;
                  plVar13 = lys_find_child(plVar13,plVar10,local_e0,name_len,0,0);
                  local_120 = plVar10;
                  if ((local_f0 & 0x300) != 0) {
                    plVar11 = lys_find_child(local_108->schema,plVar10,pcVar31,name_len,0,0x10);
                    plVar9 = (lysc_node *)0x0;
                    if (plVar13 == (lysc_node *)0x0) {
                      plVar9 = plVar11;
                    }
                    if (plVar11 != (lysc_node *)0x0) {
                      plVar13 = plVar9;
                    }
                  }
                  goto LAB_001a19db;
                }
              }
LAB_001a1a23:
              plVar5 = local_108;
            } while (result.type != LYXP_SET_NODE_SET);
LAB_001a1a3b:
            uVar32 = local_d8 + 1;
          }
          if (local_170 == (lysc_node *)0x0) goto LAB_001a2168;
          if ((local_170->nodetype & 0x18) != 0) {
            pred_idx = 0;
            temp_lo = 0;
            pred_len = 0;
            pred = (char *)0x0;
            local_f8 = (lyxp_expr *)0x0;
            opts = ly_temp_log_options(&temp_lo);
            if (local_170->nodetype == 0x10) {
              bVar33 = true;
              if ((local_170->flags & 0x200) == 0) {
                uVar23 = *tok_idx;
                for (plVar13 = lysc_node_child(local_170);
                    (plVar13 != (lysc_node *)0x0 && ((plVar13->flags & 0x100) != 0));
                    plVar13 = plVar13->next) {
                  if ((exp->used == uVar23) ||
                     (((exp->tokens[uVar23] != LYXP_TOKEN_BRACK1 ||
                       (uVar7 = uVar23 + 1, exp->used == uVar7)) ||
                      (exp->tokens[uVar7] != LYXP_TOKEN_NAMETEST)))) goto LAB_001a288e;
                  result._0_8_ = exp->expr + exp->tok_pos[uVar7];
                  local_10c = exp->tok_len[uVar7];
                  LVar8 = moveto_resolve_model
                                    ((char **)&result,&local_10c,set,local_170,(lys_module **)&sub);
                  if (((LVar8 != LY_SUCCESS) ||
                      ((sub != (lyd_node *)0x0 && ((lys_module *)sub != plVar13->module)))) ||
                     (iVar6 = ly_strncmp(plVar13->name,(char *)result._0_8_,(ulong)local_10c),
                     iVar6 != 0)) goto LAB_001a288e;
                  uVar7 = exp->used;
                  if ((uVar7 == uVar23 + 2) ||
                     (plVar4 = exp->tokens, plVar4[uVar23 + 2] != LYXP_TOKEN_OPER_EQUAL))
                  goto LAB_001a288e;
                  tok_idx_00 = uVar23 + 3;
                  iVar6 = 1;
                  uVar23 = uVar23 + 4;
                  do {
                    uVar28 = uVar23;
                    if (((iVar6 == 1) && (uVar7 != uVar28)) &&
                       (plVar4[uVar28] == LYXP_TOKEN_OPER_LOG)) goto LAB_001a288e;
                    if (uVar7 != uVar28) {
                      if (plVar4[uVar28] == LYXP_TOKEN_BRACK1) {
                        iVar6 = iVar6 + 1;
                      }
                      else {
                        iVar6 = iVar6 - (uint)(plVar4[uVar28] == LYXP_TOKEN_BRACK2);
                      }
                    }
                    uVar23 = uVar28 + 1;
                  } while (iVar6 != 0);
                  LVar8 = eval_name_test_try_compile_predicate_append
                                    (exp,tok_idx_00,uVar28 - 1,local_170,set,plVar13,&pred,&pred_len
                                    );
                  if (LVar8 != LY_SUCCESS) goto LAB_001a288e;
                }
LAB_001a2840:
                LVar8 = ly_path_parse_predicate
                                  (set->ctx,local_170,pred,(ulong)pred_len,0x10,0x200,&local_f8);
                bVar33 = true;
                if (LVar8 == LY_SUCCESS) {
                  if ((set->field_10).cur_node == (lyd_node *)0x0) {
                    plVar13 = (lysc_node *)0x0;
                  }
                  else {
                    plVar13 = ((set->field_10).cur_node)->schema;
                  }
                  LVar8 = ly_path_compile_predicate
                                    (set->ctx,plVar13,set->cur_mod,local_170,local_f8,&pred_idx,
                                     LY_VALUE_JSON,(void *)0x0,&local_100);
                  if (LVar8 == LY_SUCCESS) {
                    *tok_idx = uVar23;
                    bVar33 = false;
                  }
                }
                else {
LAB_001a288e:
                  bVar33 = true;
                }
              }
            }
            else {
              uVar7 = *tok_idx;
              uVar28 = exp->used;
              bVar33 = true;
              if ((((uVar28 != uVar7) && (plVar4 = exp->tokens, plVar4[uVar7] == LYXP_TOKEN_BRACK1))
                  && (uVar28 != uVar7 + 1)) && (plVar4[uVar7 + 1] == LYXP_TOKEN_DOT)) {
                if ((uVar28 == uVar7 + 2) || (plVar4[uVar7 + 2] != LYXP_TOKEN_OPER_EQUAL))
                goto LAB_001a288e;
                iVar6 = 1;
                uVar23 = uVar7 + 4;
                do {
                  uVar29 = uVar23;
                  if (((iVar6 == 1) && (uVar28 != uVar29)) &&
                     (plVar4[uVar29] == LYXP_TOKEN_OPER_LOG)) goto LAB_001a288e;
                  if (uVar28 != uVar29) {
                    if (plVar4[uVar29] == LYXP_TOKEN_BRACK1) {
                      iVar6 = iVar6 + 1;
                    }
                    else {
                      iVar6 = iVar6 - (uint)(plVar4[uVar29] == LYXP_TOKEN_BRACK2);
                    }
                  }
                  uVar23 = uVar29 + 1;
                } while (iVar6 != 0);
                LVar8 = eval_name_test_try_compile_predicate_append
                                  (exp,uVar7 + 3,uVar29 - 1,local_170,set,local_170,&pred,&pred_len)
                ;
                if (LVar8 == LY_SUCCESS) goto LAB_001a2840;
              }
            }
            ly_temp_log_options(opts);
            lyxp_expr_free(set->ctx,local_f8);
            free(pred);
            if (bVar33) goto LAB_001a2168;
          }
          goto LAB_001a13ad;
        }
LAB_001a149f:
        local_170 = (lysc_node *)0x0;
      }
      else {
LAB_001a13a9:
        local_170 = (lysc_node *)0x0;
LAB_001a13ad:
        predicates = local_100;
        pcVar31 = ncname_dict;
        plVar10 = moveto_mod;
        bVar33 = (options & 0x1c) != 0;
        cVar17 = (char)((options & 0x20) >> 5);
        uVar23 = options;
        if (axis == LYXP_AXIS_ATTRIBUTE) {
          if (bVar33 && cVar17 == '\0') {
            set_scnode_clear_ctx(set,0);
LAB_001a1e65:
            LVar30 = LY_SUCCESS;
          }
          else {
            if (all_desc == '\0') {
              if ((options & 0x20) == 0) {
                if (set->type != LYXP_SET_NODE_SET) goto LAB_001a1df5;
                uVar7 = 0;
LAB_001a2003:
                if (uVar7 < set->used) {
                  if ((set->val).nodes[uVar7].type == LYXP_NODE_ELEM) goto code_r0x001a201f;
                  goto LAB_001a20a8;
                }
LAB_001a23c1:
                LVar30 = LY_SUCCESS;
                goto LAB_001a1e6e;
              }
            }
            else if ((options & 0x20) == 0) {
              if (set->type == LYXP_SET_NODE_SET) {
                set_00 = set_copy(set);
                LVar8 = moveto_node_alldesc_child(set_00,(lys_module *)0x0,(char *)0x0,options);
                if (LVar8 == LY_SUCCESS) {
                  LVar8 = moveto_union(set,set_00);
                  lyxp_set_free(set_00);
                  if (LVar8 == LY_SUCCESS) {
                    uVar7 = 0;
LAB_001a230c:
                    if (uVar7 < set->used) {
                      if ((set->val).nodes[uVar7].type == LYXP_NODE_ELEM) goto code_r0x001a2328;
                      goto LAB_001a23b1;
                    }
                    goto LAB_001a23c1;
                  }
                }
                else {
                  lyxp_set_free(set_00);
                }
                goto LAB_001a1ea7;
              }
LAB_001a1df5:
              plVar26 = set->ctx;
              pcVar31 = print_set_type(set);
              ly_vlog(plVar26,(char *)0x0,LYVE_XPATH,"Cannot apply XPath operation %s on %s.",
                      "path operator",pcVar31);
              LVar8 = LY_EVALID;
              goto LAB_001a1ea7;
            }
LAB_001a1ddd:
            LVar30 = LY_SUCCESS;
          }
        }
        else {
          if (!bVar33 || cVar17 != '\0') {
            if (axis == LYXP_AXIS_CHILD && all_desc != '\0') {
              LVar8 = moveto_node_alldesc_child(set,moveto_mod,ncname_dict,options);
            }
            else if ((axis == LYXP_AXIS_CHILD) && (local_170 != (lysc_node *)0x0)) {
              pred = (char *)0x0;
              uVar1 = local_170->nodetype;
              if ((local_100 == (ly_path_predicate *)0x0) && ((uVar1 & 0x18) != 0)) {
                __assert_fail("scnode && (!(scnode->nodetype & (LYS_LIST | LYS_LEAFLIST)) || predicates)"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                              ,0x1846,
                              "LY_ERR moveto_node_hash_child(struct lyxp_set *, const struct lysc_node *, const struct ly_path_predicate *, uint32_t)"
                             );
              }
              set_init(&result,set);
              LVar8 = LY_SUCCESS;
              if ((options & 0x20) == 0) {
                if (set->type == LYXP_SET_NODE_SET) {
                  if (((set->root_type == LYXP_NODE_ROOT_CONFIG) && ((local_170->flags & 2) != 0))
                     || ((set->context_op != (lysc_node *)0x0 &&
                         (set->context_op != local_170 && (uVar1 & 0x700) != 0)))) {
                    lyxp_set_free_content(set);
                    LVar8 = LY_SUCCESS;
                  }
                  else {
                    if (uVar1 == 8) {
                      LVar8 = lyd_create_term2(local_170,
                                               &(predicates->field_1).field_1.field_1.value,
                                               (lyd_node **)&pred);
LAB_001a25d5:
                      if (LVar8 != LY_SUCCESS) goto LAB_001a1761;
                    }
                    else if (uVar1 == 0x10) {
                      LVar8 = lyd_create_list(local_170,predicates,(lyxp_var *)0x0,'\x01',
                                              (lyd_node **)&pred);
                      goto LAB_001a25d5;
                    }
                    lVar22 = 0;
                    for (uVar32 = 0; uVar32 < set->used; uVar32 = uVar32 + 1) {
                      plVar2 = (set->val).nodes;
                      iVar6 = *(int *)((long)&plVar2->type + lVar22);
                      if (iVar6 - 1U < 2) {
                        if (*(long *)((long)&plVar2->node + lVar22) != 0) {
                          __assert_fail("!set->val.nodes[i].node",
                                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                                        ,0x186a,
                                        "LY_ERR moveto_node_hash_child(struct lyxp_set *, const struct lysc_node *, const struct ly_path_predicate *, uint32_t)"
                                       );
                        }
                        plVar15 = set->tree;
                      }
                      else if (iVar6 == 3) {
                        plVar15 = lyd_child(*(lyd_node **)((long)&plVar2->node + lVar22));
                      }
                      else {
                        plVar15 = (lyd_node *)0x0;
                      }
                      if (pred == (char *)0x0) {
                        LVar8 = lyd_find_sibling_val(plVar15,local_170,(char *)0x0,0,&sub);
                      }
                      else {
                        LVar8 = lyd_find_sibling_first(plVar15,(lyd_node *)pred,&sub);
                      }
                      if (LVar8 == LY_ENOTFOUND) {
                        LVar8 = lyd_find_sibling_opaq_next(plVar15,local_170->name,&sub);
                      }
                      if ((LVar8 != LY_ENOTFOUND) && (LVar8 != LY_SUCCESS)) goto LAB_001a1761;
                      if ((sub == (lyd_node *)0x0 || (options & 1) != 0) ||
                         (plVar16 = lysc_has_when(sub->schema), plVar16 == (lysc_when *)0x0)) {
                        if (sub != (lyd_node *)0x0) goto LAB_001a26d9;
                      }
                      else {
                        if ((sub->flags & 2) == 0) {
                          LVar8 = LY_EINCOMPLETE;
                          goto LAB_001a1761;
                        }
LAB_001a26d9:
                        set_insert_node(&result,sub,0,LYXP_NODE_ELEM,result.used);
                      }
                      lVar22 = lVar22 + 0x10;
                    }
                    lyxp_set_free_content(set);
                    memcpy(set,&result,0x90);
                    result.type = LYXP_SET_NUMBER;
                    iVar6 = set_sort(set);
                    LVar8 = LY_SUCCESS;
                    if (iVar6 != 0) {
                      __assert_fail("!set_sort(set)",
                                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                                    ,0x188f,
                                    "LY_ERR moveto_node_hash_child(struct lyxp_set *, const struct lysc_node *, const struct ly_path_predicate *, uint32_t)"
                                   );
                    }
                  }
                }
                else {
                  plVar26 = set->ctx;
                  pcVar31 = print_set_type(set);
                  ly_vlog(plVar26,(char *)0x0,LYVE_XPATH,"Cannot apply XPath operation %s on %s.",
                          "path operator",pcVar31);
                  LVar8 = LY_EVALID;
                }
              }
LAB_001a1761:
              lyxp_set_free_content(&result);
              lyd_free_tree((lyd_node *)pred);
            }
            else {
              if ((all_desc != '\0') &&
                 (LVar8 = xpath_pi_node(set,LYXP_AXIS_DESCENDANT_OR_SELF,options),
                 LVar8 != LY_SUCCESS)) goto LAB_001a1ea7;
              LVar8 = moveto_node(set,moveto_mod,ncname_dict,axis,options);
            }
            if (LVar8 == LY_SUCCESS) goto LAB_001a1e65;
            goto LAB_001a1ea7;
          }
          uVar7 = set->used;
          puVar21 = (undefined8 *)0x0;
          for (lVar22 = 0; (ulong)uVar7 * 0x18 - lVar22 != 0; lVar22 = lVar22 + 0x18) {
            if (*(int *)((long)&((set->val).nodes)->pos + lVar22) == 2) {
              if (puVar21 != (undefined8 *)0x0) {
                puVar21 = (undefined8 *)0x0;
                break;
              }
              puVar21 = (undefined8 *)((long)&((set->val).nodes)->node + lVar22);
            }
          }
          if (axis == LYXP_AXIS_CHILD && all_desc != '\0') {
            if (set->type == LYXP_SET_SCNODE_SET) {
              for (uVar32 = 0; uVar32 != uVar7; uVar32 = uVar32 + 1) {
                lVar22 = uVar32 * 0x18;
                iVar6 = *(int *)((long)(set->val).nodes + lVar22 + 0xc);
                uVar20 = 0xffffffff;
                if (iVar6 == -2) {
LAB_001a1ae1:
                  *(undefined4 *)((long)(set->val).nodes + lVar22 + 0xc) = uVar20;
                  iVar6 = *(int *)((long)(set->val).nodes + lVar22 + 8);
                  if (iVar6 - 1U < 2) {
                    result._0_8_ = result._0_8_ & 0xffffffff00000000;
                    while (plVar12 = ly_ctx_get_module_iter(set->ctx,&result.type),
                          plVar12 != (lys_module *)0x0) {
                      if (plVar12->compiled != (lysc_module *)0x0) {
                        plVar13 = (lysc_node *)0x0;
                        while (plVar13 = lys_getnext(plVar13,(lysc_node *)0x0,plVar12->compiled,0),
                              plVar13 != (lysc_node *)0x0) {
                          LVar8 = moveto_scnode_dfs(set,plVar13,(uint32_t)uVar32,plVar10,pcVar31,
                                                    options);
                          if (LVar8 != LY_SUCCESS) {
                            LVar8 = LY_EMEM;
                            goto LAB_001a1d9b;
                          }
                        }
                      }
                    }
                  }
                  else if ((iVar6 == 3) &&
                          (LVar8 = moveto_scnode_dfs(set,*(lysc_node **)
                                                          ((long)(set->val).nodes + lVar22),
                                                     (uint32_t)uVar32,plVar10,pcVar31,options),
                          LVar8 != LY_SUCCESS)) goto LAB_001a1d9b;
                }
                else if (iVar6 == 2) {
                  uVar20 = 0;
                  goto LAB_001a1ae1;
                }
              }
              LVar8 = LY_SUCCESS;
            }
            else {
              plVar26 = set->ctx;
              pcVar31 = print_set_type(set);
              ly_vlog(plVar26,(char *)0x0,LYVE_XPATH,"Cannot apply XPath operation %s on %s.",
                      "path operator",pcVar31);
              LVar8 = LY_EVALID;
            }
          }
          else {
            if ((all_desc != '\0') &&
               (LVar8 = xpath_pi_node(set,LYXP_AXIS_DESCENDANT_OR_SELF,options), LVar8 != LY_SUCCESS
               )) goto LAB_001a1ea7;
            LVar8 = moveto_scnode(set,moveto_mod,ncname_dict,axis,options);
          }
LAB_001a1d9b:
          pcVar31 = ncname;
          if (LVar8 != LY_SUCCESS) goto LAB_001a1ea7;
          uVar7 = set->used;
          do {
            uVar7 = uVar7 - 1;
            iVar6 = *(int *)((long)(set->val).nodes + (ulong)uVar7 * 0x18 + 0xc);
            if (uVar7 == 0) break;
          } while (iVar6 < 1);
          if (0 < iVar6) goto LAB_001a1ddd;
          uVar32 = (ulong)ncname_len;
          pcVar25 = exp->expr;
          pcVar19 = lysc_path((set->field_10).cur_scnode,LYSC_PATH_LOG,(char *)0x0,0);
          if (puVar21 == (undefined8 *)0x0) {
LAB_001a220c:
            if ((options & 0x40) == 0) {
              ly_log(set->ctx,LY_LLWRN,LY_SUCCESS,
                     "Schema node \"%.*s\" not found; in expr \"%.*s\" with context node \"%s\".",
                     uVar32,pcVar31,pcVar31 + (uVar32 - (long)pcVar25),pcVar25,pcVar19);
              pcVar14 = (char *)0x0;
              goto LAB_001a2251;
            }
            ly_log(set->ctx,LY_LLERR,LY_ENOTFOUND,
                   "Schema node \"%.*s\" not found; in expr \"%.*s\" with context node \"%s\".",
                   uVar32,pcVar31,pcVar31 + (uVar32 - (long)pcVar25),pcVar25,pcVar19);
            pcVar14 = (char *)0x0;
LAB_001a22c6:
            free(pcVar19);
            free(pcVar14);
            set->not_found = '\x01';
          }
          else {
            iVar6 = *(int *)(puVar21 + 1);
            if (iVar6 == 1) {
              pcVar14 = "<root>";
LAB_001a21b9:
              pcVar14 = strdup(pcVar14);
            }
            else {
              if (iVar6 == 2) {
                pcVar14 = "<config-root>";
                goto LAB_001a21b9;
              }
              if (iVar6 != 3) goto LAB_001a220c;
              pcVar14 = lysc_path((lysc_node *)*puVar21,LYSC_PATH_LOG,(char *)0x0,0);
            }
            if (pcVar14 == (char *)0x0) goto LAB_001a220c;
            if ((options & 0x40) != 0) {
              ly_log(set->ctx,LY_LLERR,LY_ENOTFOUND,
                     "Schema node \"%.*s\" for parent \"%s\" not found; in expr \"%.*s\" with context node \"%s\"."
                     ,uVar32,pcVar31,pcVar14,pcVar31 + (uVar32 - (long)pcVar25),pcVar25,pcVar19);
              goto LAB_001a22c6;
            }
            ly_log(set->ctx,LY_LLWRN,LY_SUCCESS,
                   "Schema node \"%.*s\" for parent \"%s\" not found; in expr \"%.*s\" with context node \"%s\"."
                   ,uVar32,pcVar31,pcVar14,pcVar31 + (uVar32 - (long)pcVar25),pcVar25,pcVar19);
LAB_001a2251:
            free(pcVar19);
            free(pcVar14);
          }
          uVar23 = options | 0x20;
          LVar30 = LY_ENOT;
        }
LAB_001a1e6e:
        do {
          LVar8 = LVar30;
          if ((exp->used == *tok_idx) || (exp->tokens[*tok_idx] != LYXP_TOKEN_BRACK1)) break;
          LVar8 = eval_predicate(exp,tok_idx,set,uVar23,axis);
        } while (LVar8 == LY_SUCCESS);
      }
LAB_001a1ea7:
      lydict_remove(set->ctx,ncname_dict);
      if (local_100 != (ly_path_predicate *)0x0) {
        ly_path_predicates_free(local_170->module->ctx,local_100);
      }
      if (LVar8 != LY_SUCCESS) {
        if (LVar8 != LY_ENOT) {
          return LVar8;
        }
        if ((options & 0x1c) == 0) {
          __assert_fail("options & LYXP_SCNODE_ALL",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                        ,0x2115,
                        "LY_ERR eval_relative_location_path(const struct lyxp_expr *, uint32_t *, ly_bool, struct lyxp_set *, uint32_t)"
                       );
        }
        options = options | 0x20;
      }
      break;
    case LYXP_TOKEN_NODETYPE:
      if ((options & 0x20) == 0) {
        if (exp->tok_len[uVar32] != 4) {
          __assert_fail("exp->tok_len[*tok_idx] == 4",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                        ,0x2086,
                        "LY_ERR eval_node_type_with_predicate(const struct lyxp_expr *, uint32_t *, enum lyxp_axis, ly_bool, struct lyxp_set *, uint32_t)"
                       );
        }
        uVar7 = exp->tok_pos[uVar32];
        pcVar31 = exp->expr;
        iVar6 = strncmp(pcVar31 + uVar7,"node",4);
        if (iVar6 == 0) {
          LVar8 = xpath_pi_node(set,axis,options);
          pcVar31 = "parsed";
          if (LVar8 != LY_SUCCESS) {
            return LVar8;
          }
        }
        else {
          iVar6 = strncmp(pcVar31 + uVar7,"text",4);
          if (iVar6 != 0) {
            __assert_fail("!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], \"text\", 4)",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                          ,0x208a,
                          "LY_ERR eval_node_type_with_predicate(const struct lyxp_expr *, uint32_t *, enum lyxp_axis, ly_bool, struct lyxp_set *, uint32_t)"
                         );
          }
          if ((options & 0x1c) == 0) {
            if (set->type != LYXP_SET_NODE_SET) {
              plVar26 = set->ctx;
              pcVar25 = print_set_type(set);
              pcVar19 = "Invalid context type %s in %s.";
              pcVar31 = "text()";
              goto LAB_001a29b8;
            }
            if (axis == LYXP_AXIS_CHILD) {
              lVar22 = 8;
              for (uVar32 = 0; uVar32 < set->used; uVar32 = uVar32 + 1) {
                plVar2 = (set->val).nodes;
                uVar7 = *(uint *)((long)&plVar2->node + lVar22);
                if (uVar7 < 6) {
                  if ((0x36U >> (uVar7 & 0x1f) & 1) == 0) {
                    if (uVar7 != 3) {
                      plVar26 = set->ctx;
                      uVar27 = 0x1601;
                      goto LAB_001a29e6;
                    }
                    pbVar3 = *(byte **)(*(long *)((long)plVar2 + lVar22 + -8) + 8);
                    if ((pbVar3 == (byte *)0x0) || ((*pbVar3 & 0xc) != 0)) {
                      *(undefined4 *)((long)&plVar2->node + lVar22) = 4;
                      goto LAB_001a1696;
                    }
                  }
                  set_remove_node_none(set,(uint32_t)uVar32);
                }
LAB_001a1696:
                lVar22 = lVar22 + 0x10;
              }
              set_remove_nodes_none(set);
              pcVar31 = "parsed";
              goto LAB_001a1c1f;
            }
            lyxp_set_free_content(set);
          }
          else {
            set_scnode_clear_ctx(set,1);
          }
          pcVar31 = "parsed";
        }
      }
LAB_001a1c1f:
      pcVar25 = lyxp_token2str(exp->tokens[*tok_idx]);
      ly_log_dbg(2,"%-27s %s %s[%u]","eval_node_type_with_predicate",pcVar31,pcVar25,
                 (ulong)exp->tok_pos[*tok_idx]);
      uVar7 = *tok_idx + 1;
      *tok_idx = uVar7;
      if (exp->tokens[uVar7] != LYXP_TOKEN_PAR1) {
        __assert_fail("exp->tokens[*tok_idx] == LYXP_TOKEN_PAR1",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                      ,0x2094,
                      "LY_ERR eval_node_type_with_predicate(const struct lyxp_expr *, uint32_t *, enum lyxp_axis, ly_bool, struct lyxp_set *, uint32_t)"
                     );
      }
      ly_log_dbg(2,"%-27s %s %s[%u]","eval_node_type_with_predicate",pcVar31,"(",
                 (ulong)exp->tok_pos[uVar7]);
      uVar7 = *tok_idx + 1;
      *tok_idx = uVar7;
      if (exp->tokens[uVar7] != LYXP_TOKEN_PAR2) {
        __assert_fail("exp->tokens[*tok_idx] == LYXP_TOKEN_PAR2",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                      ,0x209a,
                      "LY_ERR eval_node_type_with_predicate(const struct lyxp_expr *, uint32_t *, enum lyxp_axis, ly_bool, struct lyxp_set *, uint32_t)"
                     );
      }
      ly_log_dbg(2,"%-27s %s %s[%u]","eval_node_type_with_predicate",pcVar31,")",
                 (ulong)exp->tok_pos[uVar7]);
      *tok_idx = *tok_idx + 1;
      while ((exp->used != *tok_idx && (exp->tokens[*tok_idx] == LYXP_TOKEN_BRACK1))) {
        LVar8 = eval_predicate(exp,tok_idx,set,options,axis);
        if (LVar8 != LY_SUCCESS) {
          return LVar8;
        }
      }
    }
    uVar7 = *tok_idx;
    if ((exp->used == uVar7) || ((exp->tokens[uVar7] & ~LYXP_TOKEN_PAR1) != LYXP_TOKEN_OPER_PATH)) {
      return LY_SUCCESS;
    }
    if (exp->tok_len[uVar7] == 1) {
      all_desc = '\0';
    }
    else {
      if (exp->tok_len[uVar7] != 2) {
        __assert_fail("exp->tok_len[*tok_idx] == 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                      ,0x20c4,
                      "LY_ERR eval_relative_location_path(const struct lyxp_expr *, uint32_t *, ly_bool, struct lyxp_set *, uint32_t)"
                     );
      }
      all_desc = '\x01';
    }
    pcVar31 = "skipped";
    if ((options & 0x20) == 0) {
      pcVar31 = "parsed";
    }
    pcVar25 = lyxp_token2str(exp->tokens[uVar7]);
    ly_log_dbg(2,"%-27s %s %s[%u]","eval_relative_location_path",pcVar31,pcVar25,
               (ulong)exp->tok_pos[*tok_idx]);
    uVar7 = *tok_idx + 1;
    *tok_idx = uVar7;
  } while( true );
code_r0x001a2328:
  bVar33 = false;
  pplVar24 = (lysc_node **)&((set->val).nodes[uVar7].node)->meta;
  while (plVar13 = *pplVar24, plVar13 != (lysc_node *)0x0) {
    if (((plVar10 == (lys_module *)0x0) ||
        ((lys_module *)(((lyd_node_inner *)plVar13->parent)->field_0).node.parent == plVar10)) &&
       ((pcVar31 == (char *)0x0 || ((lyd_node *)plVar13->next == (lyd_node *)pcVar31)))) {
      if (bVar33) {
        set_insert_node(set,(lyd_node *)plVar13,(set->val).nodes[uVar7].pos,LYXP_NODE_META,uVar7 + 1
                       );
      }
      else {
        (set->val).nodes[uVar7].node = (lyd_node *)plVar13;
        (set->val).nodes[uVar7].type = LYXP_NODE_META;
      }
      uVar7 = uVar7 + 1;
      bVar33 = true;
    }
    pplVar24 = (lysc_node **)&plVar13->module;
  }
  if (!bVar33) {
LAB_001a23b1:
    set_remove_node(set,uVar7);
  }
  goto LAB_001a230c;
code_r0x001a201f:
  bVar33 = false;
  pplVar24 = (lysc_node **)&((set->val).nodes[uVar7].node)->meta;
  while (plVar13 = *pplVar24, plVar13 != (lysc_node *)0x0) {
    if (((plVar10 == (lys_module *)0x0) ||
        ((lys_module *)(((lyd_node_inner *)plVar13->parent)->field_0).node.parent == plVar10)) &&
       ((pcVar31 == (char *)0x0 || ((lyd_node *)plVar13->next == (lyd_node *)pcVar31)))) {
      if (bVar33) {
        set_insert_node(set,(lyd_node *)plVar13,(set->val).nodes[uVar7].pos,LYXP_NODE_META,uVar7 + 1
                       );
      }
      else {
        (set->val).nodes[uVar7].node = (lyd_node *)plVar13;
        (set->val).nodes[uVar7].type = LYXP_NODE_META;
      }
      uVar7 = uVar7 + 1;
      bVar33 = true;
    }
    pplVar24 = (lysc_node **)&plVar13->module;
  }
  if (!bVar33) {
LAB_001a20a8:
    set_remove_node(set,uVar7);
  }
  goto LAB_001a2003;
}

Assistant:

static LY_ERR
eval_relative_location_path(const struct lyxp_expr *exp, uint32_t *tok_idx, ly_bool all_desc, struct lyxp_set *set,
        uint32_t options)
{
    LY_ERR rc = LY_SUCCESS;
    enum lyxp_axis axis;
    int scnode_skip_path = 0;

    goto step;
    do {
        /* evaluate '/' or '//' */
        if (exp->tok_len[*tok_idx] == 1) {
            all_desc = 0;
        } else {
            assert(exp->tok_len[*tok_idx] == 2);
            all_desc = 1;
        }
        LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (options & LYXP_SKIP_EXPR ? "skipped" : "parsed"),
                lyxp_token2str(exp->tokens[*tok_idx]), exp->tok_pos[*tok_idx]);
        ++(*tok_idx);

step:
        /* AxisSpecifier */
        if (exp->tokens[*tok_idx] == LYXP_TOKEN_AXISNAME) {
            axis = str2axis(exp->expr + exp->tok_pos[*tok_idx], exp->tok_len[*tok_idx]);

            LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (options & LYXP_SKIP_EXPR ? "skipped" : "parsed"),
                    lyxp_token2str(exp->tokens[*tok_idx]), exp->tok_pos[*tok_idx]);
            ++(*tok_idx);

            assert(exp->tokens[*tok_idx] == LYXP_TOKEN_DCOLON);
            LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (options & LYXP_SKIP_EXPR ? "skipped" : "parsed"),
                    lyxp_token2str(exp->tokens[*tok_idx]), exp->tok_pos[*tok_idx]);
            ++(*tok_idx);
        } else if (exp->tokens[*tok_idx] == LYXP_TOKEN_AT) {
            axis = LYXP_AXIS_ATTRIBUTE;

            LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (options & LYXP_SKIP_EXPR ? "skipped" : "parsed"),
                    lyxp_token2str(exp->tokens[*tok_idx]), exp->tok_pos[*tok_idx]);
            ++(*tok_idx);
        } else {
            /* default */
            axis = LYXP_AXIS_CHILD;
        }

        /* NodeTest Predicate* */
        switch (exp->tokens[*tok_idx]) {
        case LYXP_TOKEN_DOT:
            /* evaluate '.' */
            if (!(options & LYXP_SKIP_EXPR)) {
                if (((options & LYXP_SCNODE_ALL) && (set->type != LYXP_SET_SCNODE_SET)) ||
                        (!(options & LYXP_SCNODE_ALL) && (set->type != LYXP_SET_NODE_SET))) {
                    LOGVAL(set->ctx, LY_VCODE_XP_INOP_1, "path operator", print_set_type(set));
                    rc = LY_EVALID;
                    goto cleanup;
                }

                if (all_desc) {
                    rc = xpath_pi_node(set, LYXP_AXIS_DESCENDANT_OR_SELF, options);
                    LY_CHECK_GOTO(rc, cleanup);
                }
                rc = xpath_pi_node(set, LYXP_AXIS_SELF, options);
                LY_CHECK_GOTO(rc, cleanup);
            }
            LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
                    lyxp_token2str(exp->tokens[*tok_idx]), exp->tok_pos[*tok_idx]);
            ++(*tok_idx);
            break;

        case LYXP_TOKEN_DDOT:
            /* evaluate '..' */
            if (!(options & LYXP_SKIP_EXPR)) {
                if (((options & LYXP_SCNODE_ALL) && (set->type != LYXP_SET_SCNODE_SET)) ||
                        (!(options & LYXP_SCNODE_ALL) && (set->type != LYXP_SET_NODE_SET))) {
                    LOGVAL(set->ctx, LY_VCODE_XP_INOP_1, "path operator", print_set_type(set));
                    rc = LY_EVALID;
                    goto cleanup;
                }

                if (all_desc) {
                    rc = xpath_pi_node(set, LYXP_AXIS_DESCENDANT_OR_SELF, options);
                    LY_CHECK_GOTO(rc, cleanup);
                }
                rc = xpath_pi_node(set, LYXP_AXIS_PARENT, options);
                LY_CHECK_GOTO(rc, cleanup);
            }
            LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (options & LYXP_SKIP_EXPR ? "skipped" : "parsed"),
                    lyxp_token2str(exp->tokens[*tok_idx]), exp->tok_pos[*tok_idx]);
            ++(*tok_idx);
            break;

        case LYXP_TOKEN_NAMETEST:
            /* evaluate NameTest Predicate* */
            rc = eval_name_test_with_predicate(exp, tok_idx, axis, all_desc, set, options);
            if (rc == LY_ENOT) {
                assert(options & LYXP_SCNODE_ALL);
                rc = LY_SUCCESS;

                /* skip the rest of this path */
                scnode_skip_path = 1;
                options |= LYXP_SKIP_EXPR;
            }
            LY_CHECK_GOTO(rc, cleanup);
            break;

        case LYXP_TOKEN_NODETYPE:
            /* evaluate NodeType Predicate* */
            rc = eval_node_type_with_predicate(exp, tok_idx, axis, all_desc, set, options);
            LY_CHECK_GOTO(rc, cleanup);
            break;

        default:
            LOGINT(set->ctx);
            rc = LY_EINT;
            goto cleanup;
        }
    } while (!exp_check_token2(NULL, exp, *tok_idx, LYXP_TOKEN_OPER_PATH, LYXP_TOKEN_OPER_RPATH));

cleanup:
    if (scnode_skip_path) {
        options &= ~LYXP_SKIP_EXPR;
    }
    return rc;
}